

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgsession-decoder.c
# Opt level: O1

int mg_session_read_bolt_message(mg_session *session,mg_message **message)

{
  mg_message *buf;
  char cVar1;
  int iVar2;
  mg_message_type mVar3;
  undefined8 in_RAX;
  char *fmt;
  uint8_t marker;
  uint8_t signature;
  undefined2 local_22;
  undefined2 uVar4;
  
  uVar4 = (undefined2)((ulong)in_RAX >> 0x38);
  iVar2 = mg_session_read_uint8(session,(uint8_t *)&local_22);
  if (iVar2 != 0) {
    return iVar2;
  }
  iVar2 = mg_session_read_uint8(session,(uint8_t *)((long)&local_22 + 1));
  if (iVar2 != 0) {
    return iVar2;
  }
  local_22 = uVar4;
  buf = (mg_message *)mg_allocator_malloc(session->decoder_allocator,0x10);
  if (buf == (mg_message *)0x0) {
    mg_session_set_error(session,"out of memory");
    return -3;
  }
  fmt = "unknown message type";
  if (0x3e < local_22._1_1_) {
    if (0x70 < local_22._1_1_) {
      if (local_22._1_1_ == 0x71) {
        if ((byte)local_22 == 0xb1) {
          buf->type = MG_MESSAGE_TYPE_RECORD;
          iVar2 = mg_session_read_record_message(session,&(buf->field_1).record_v);
          goto joined_r0x00108115;
        }
      }
      else {
        if (local_22._1_1_ != 0x7f) goto LAB_00108120;
        if ((byte)local_22 == 0xb1) {
          buf->type = MG_MESSAGE_TYPE_FAILURE;
          iVar2 = mg_session_read_failure_message(session,&(buf->field_1).failure_v);
          goto joined_r0x00108115;
        }
      }
      goto LAB_00108119;
    }
    if (local_22._1_1_ == 0x3f) {
      if ((session->version == 4 | 0xb0U) != (byte)local_22) goto LAB_001080a2;
      buf->type = MG_MESSAGE_TYPE_PULL;
      iVar2 = mg_session_read_pull_message(session,&(buf->field_1).pull_v);
      goto LAB_00108090;
    }
    if (local_22._1_1_ == 0x70) {
      if ((byte)local_22 == 0xb1) {
        buf->type = MG_MESSAGE_TYPE_SUCCESS;
        iVar2 = mg_session_read_success_message(session,&(buf->field_1).success_v);
        goto joined_r0x00108115;
      }
      goto LAB_00108119;
    }
    goto LAB_00108120;
  }
  switch(local_22._1_1_) {
  case 0xe:
    mVar3 = MG_MESSAGE_TYPE_ACK_FAILURE;
    break;
  case 0xf:
    mVar3 = MG_MESSAGE_TYPE_RESET;
    break;
  case 0x10:
    if ((session->version == 4 | 0xb2U) == (byte)local_22) {
      buf->type = MG_MESSAGE_TYPE_RUN;
      iVar2 = mg_session_read_run_message(session,&(buf->field_1).run_v);
LAB_00108090:
      cVar1 = (iVar2 != 0) * '\x02' + '\x06';
    }
    else {
LAB_001080a2:
      cVar1 = '\a';
      iVar2 = 0;
    }
    if (cVar1 == '\x06') goto LAB_001080f0;
    if (cVar1 == '\a') goto LAB_00108119;
    goto LAB_0010812f;
  case 0x11:
    if ((byte)local_22 == 0xb1) {
      buf->type = MG_MESSAGE_TYPE_BEGIN;
      iVar2 = mg_session_read_begin_message(session,&(buf->field_1).begin_v);
      goto joined_r0x00108115;
    }
    goto LAB_00108119;
  case 0x12:
    mVar3 = MG_MESSAGE_TYPE_COMMIT;
    break;
  case 0x13:
    mVar3 = MG_MESSAGE_TYPE_ROLLBACK;
    break;
  default:
    if (local_22._1_1_ != 1) goto LAB_00108120;
    if (session->version == 1) {
      if ((byte)local_22 == 0xb2) {
        buf->type = MG_MESSAGE_TYPE_INIT;
        iVar2 = mg_session_read_init_message(session,&(buf->field_1).init_v);
joined_r0x00108115:
        if (iVar2 != 0) goto LAB_0010812f;
        goto LAB_001080f0;
      }
    }
    else if ((byte)local_22 == 0xb1) {
      buf->type = MG_MESSAGE_TYPE_HELLO;
      iVar2 = mg_session_read_hello_message(session,&(buf->field_1).hello_v);
      goto joined_r0x00108115;
    }
    goto LAB_00108119;
  }
  if ((byte)local_22 == 0xb0) {
    buf->type = mVar3;
LAB_001080f0:
    *message = buf;
    iVar2 = 0;
  }
  else {
LAB_00108119:
    fmt = "wrong value marker";
LAB_00108120:
    mg_session_set_error(session,fmt);
    iVar2 = -10;
LAB_0010812f:
    mg_allocator_free(session->decoder_allocator,buf);
  }
  return iVar2;
}

Assistant:

int mg_session_read_bolt_message(mg_session *session, mg_message **message) {
  uint8_t marker;
  MG_RETURN_IF_FAILED(mg_session_read_uint8(session, &marker));

  uint8_t signature;
  MG_RETURN_IF_FAILED(mg_session_read_uint8(session, &signature));

  mg_message *tmessage =
      mg_allocator_malloc(session->decoder_allocator, sizeof(mg_message));
  if (!tmessage) {
    mg_session_set_error(session, "out of memory");
    return MG_ERROR_OOM;
  }

  int status = 0;

  switch (signature) {
    case MG_SIGNATURE_MESSAGE_SUCCESS:
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + 1)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_SUCCESS;
      status = mg_session_read_success_message(session, &tmessage->success_v);
      if (status != 0) {
        goto cleanup;
      }
      break;
    case MG_SIGNATURE_MESSAGE_FAILURE:
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + 1)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_FAILURE;
      status = mg_session_read_failure_message(session, &tmessage->failure_v);
      if (status != 0) {
        goto cleanup;
      }
      break;
    case MG_SIGNATURE_MESSAGE_RECORD:
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + 1)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_RECORD;
      status = mg_session_read_record_message(session, &tmessage->record_v);
      if (status != 0) {
        goto cleanup;
      }
      break;
    case MG_SIGNATURE_MESSAGE_HELLO:
      if (session->version == 1) {
        if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + 2)) {
          goto wrong_marker;
        }
        tmessage->type = MG_MESSAGE_TYPE_INIT;
        status = mg_session_read_init_message(session, &tmessage->init_v);
      } else {
        if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + 1)) {
          goto wrong_marker;
        }
        tmessage->type = MG_MESSAGE_TYPE_HELLO;
        status = mg_session_read_hello_message(session, &tmessage->hello_v);
      }
      if (status != 0) {
        goto cleanup;
      }
      break;
    case MG_SIGNATURE_MESSAGE_RUN: {
      int field_number = 2 + (session->version == 4);
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + field_number)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_RUN;
      status = mg_session_read_run_message(session, &tmessage->run_v);
      if (status != 0) {
        goto cleanup;
      }
      break;
    }
    case MG_SIGNATURE_MESSAGE_ACK_FAILURE:
      if (marker != MG_MARKER_TINY_STRUCT) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_ACK_FAILURE;
      break;
    case MG_SIGNATURE_MESSAGE_BEGIN:
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT + 1)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_BEGIN;
      status = mg_session_read_begin_message(session, &tmessage->begin_v);
      if (status != 0) {
        goto cleanup;
      }
      break;
    case MG_SIGNATURE_MESSAGE_COMMIT:
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_COMMIT;
      break;
    case MG_SIGNATURE_MESSAGE_ROLLBACK:
      if (marker != (uint8_t)(MG_MARKER_TINY_STRUCT)) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_ROLLBACK;
      break;
    case MG_SIGNATURE_MESSAGE_RESET:
      if (marker != MG_MARKER_TINY_STRUCT) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_RESET;
      break;
    case MG_SIGNATURE_MESSAGE_PULL: {
      uint8_t expected_marker = MG_MARKER_TINY_STRUCT + (session->version == 4);
      if (marker != expected_marker) {
        goto wrong_marker;
      }
      tmessage->type = MG_MESSAGE_TYPE_PULL;
      status = mg_session_read_pull_message(session, &tmessage->pull_v);
      if (status != 0) {
        goto cleanup;
      }
      break;
    }
    default:
      mg_session_set_error(session, "unknown message type");
      status = MG_ERROR_PROTOCOL_VIOLATION;
      goto cleanup;
  }

  *message = tmessage;
  return 0;

wrong_marker:
  mg_session_set_error(session, "wrong value marker");
  status = MG_ERROR_PROTOCOL_VIOLATION;
cleanup:
  mg_allocator_free(session->decoder_allocator, tmessage);
  return status;
}